

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O2

void __thiscall adios2::core::engine::InlineWriter::ResetVariables(InlineWriter *this)

{
  _Rb_tree_node_base *name;
  DataType DVar1;
  Variable<signed_char> *pVVar2;
  Variable<char> *pVVar3;
  Variable<std::complex<float>_> *pVVar4;
  Variable<unsigned_char> *pVVar5;
  Variable<std::complex<double>_> *pVVar6;
  Variable<double> *pVVar7;
  Variable<int> *pVVar8;
  Variable<long> *pVVar9;
  Variable<unsigned_long> *pVVar10;
  Variable<short> *pVVar11;
  Variable<unsigned_short> *pVVar12;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pVVar13;
  Variable<unsigned_int> *pVVar14;
  Variable<long_double> *pVVar15;
  Variable<float> *pVVar16;
  _Base_ptr p_Var17;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  availVars;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_278;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  
  local_50 = &uStack_60;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_40 = 0;
  local_48 = local_50;
  IO::GetAvailableVariables
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)&local_278,(this->super_Engine).m_IO,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_68);
  for (p_Var17 = local_278._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var17 != &local_278._M_impl.super__Rb_tree_header;
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
    name = p_Var17 + 1;
    DVar1 = IO::InquireVariableType((this->super_Engine).m_IO,(string *)name);
    switch(DVar1) {
    case Int8:
      std::__cxx11::string::string
                ((string *)&local_c8,"in call to BeginStep",(allocator *)&local_68);
      pVVar2 = Engine::FindVariable<signed_char>(&this->super_Engine,(string *)name,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::
      vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
      ::clear(&pVVar2->m_BlocksInfo);
      break;
    case Int16:
      std::__cxx11::string::string
                ((string *)&local_e8,"in call to BeginStep",(allocator *)&local_68);
      pVVar11 = Engine::FindVariable<short>(&this->super_Engine,(string *)name,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::
      vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
      ::clear(&pVVar11->m_BlocksInfo);
      break;
    case Int32:
      std::__cxx11::string::string
                ((string *)&local_108,"in call to BeginStep",(allocator *)&local_68);
      pVVar8 = Engine::FindVariable<int>(&this->super_Engine,(string *)name,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::
      vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
      ::clear(&pVVar8->m_BlocksInfo);
      break;
    case Int64:
      std::__cxx11::string::string
                ((string *)&local_128,"in call to BeginStep",(allocator *)&local_68);
      pVVar9 = Engine::FindVariable<long>(&this->super_Engine,(string *)name,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::
      vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
      ::clear(&pVVar9->m_BlocksInfo);
      break;
    case UInt8:
      std::__cxx11::string::string
                ((string *)&local_148,"in call to BeginStep",(allocator *)&local_68);
      pVVar5 = Engine::FindVariable<unsigned_char>(&this->super_Engine,(string *)name,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::
      vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
      ::clear(&pVVar5->m_BlocksInfo);
      break;
    case UInt16:
      std::__cxx11::string::string
                ((string *)&local_168,"in call to BeginStep",(allocator *)&local_68);
      pVVar12 = Engine::FindVariable<unsigned_short>(&this->super_Engine,(string *)name,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::
      vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
      ::clear(&pVVar12->m_BlocksInfo);
      break;
    case UInt32:
      std::__cxx11::string::string
                ((string *)&local_188,"in call to BeginStep",(allocator *)&local_68);
      pVVar14 = Engine::FindVariable<unsigned_int>(&this->super_Engine,(string *)name,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::
      vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
      ::clear(&pVVar14->m_BlocksInfo);
      break;
    case UInt64:
      std::__cxx11::string::string
                ((string *)&local_1a8,"in call to BeginStep",(allocator *)&local_68);
      pVVar10 = Engine::FindVariable<unsigned_long>(&this->super_Engine,(string *)name,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::
      vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
      ::clear(&pVVar10->m_BlocksInfo);
      break;
    case Float:
      std::__cxx11::string::string
                ((string *)&local_1c8,"in call to BeginStep",(allocator *)&local_68);
      pVVar16 = Engine::FindVariable<float>(&this->super_Engine,(string *)name,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::
      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
      ::clear(&pVVar16->m_BlocksInfo);
      break;
    case Double:
      std::__cxx11::string::string
                ((string *)&local_1e8,"in call to BeginStep",(allocator *)&local_68);
      pVVar7 = Engine::FindVariable<double>(&this->super_Engine,(string *)name,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::
      vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
      ::clear(&pVVar7->m_BlocksInfo);
      break;
    case LongDouble:
      std::__cxx11::string::string
                ((string *)&local_208,"in call to BeginStep",(allocator *)&local_68);
      pVVar15 = Engine::FindVariable<long_double>(&this->super_Engine,(string *)name,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::
      vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
      ::clear(&pVVar15->m_BlocksInfo);
      break;
    case FloatComplex:
      std::__cxx11::string::string
                ((string *)&local_228,"in call to BeginStep",(allocator *)&local_68);
      pVVar4 = Engine::FindVariable<std::complex<float>>
                         (&this->super_Engine,(string *)name,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::
      vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
      ::clear(&pVVar4->m_BlocksInfo);
      break;
    case DoubleComplex:
      std::__cxx11::string::string
                ((string *)&local_248,"in call to BeginStep",(allocator *)&local_68);
      pVVar6 = Engine::FindVariable<std::complex<double>>
                         (&this->super_Engine,(string *)name,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::
      vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
      ::clear(&pVVar6->m_BlocksInfo);
      break;
    case String:
      std::__cxx11::string::string
                ((string *)&local_88,"in call to BeginStep",(allocator *)&local_68);
      pVVar13 = Engine::FindVariable<std::__cxx11::string>
                          (&this->super_Engine,(string *)name,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::
      vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
      ::clear(&pVVar13->m_BlocksInfo);
      break;
    case Char:
      std::__cxx11::string::string
                ((string *)&local_a8,"in call to BeginStep",(allocator *)&local_68);
      pVVar3 = Engine::FindVariable<char>(&this->super_Engine,(string *)name,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::
      vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
      ::clear(&pVVar3->m_BlocksInfo);
    }
  }
  this->m_ResetVariables = false;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree(&local_278);
  return;
}

Assistant:

void InlineWriter::ResetVariables()
{
    auto availVars = m_IO.GetAvailableVariables();
    for (auto &varPair : availVars)
    {
        const auto &name = varPair.first;
        const DataType type = m_IO.InquireVariableType(name);

        if (type == DataType::Struct)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable = FindVariable<T>(name, "in call to BeginStep");                     \
        variable.m_BlocksInfo.clear();                                                             \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
    m_ResetVariables = false;
}